

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall rest_rpc::rpc_client::clear_cache(rpc_client *this)

{
  bool bVar1;
  reference pvVar2;
  const_pointer __ptr;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lock_1;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  *in_stack_ffffffffffffffe0;
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::
            deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
            ::empty((deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                     *)0x25f3c5);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar2 = std::
             deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
             ::front(in_stack_ffffffffffffffe0);
    __ptr = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data
                      (&pvVar2->content);
    free(__ptr);
    std::
    deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
    ::pop_front((deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                 *)in_RDI);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffc8);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>_>_>
  ::clear((unordered_map<unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>_>_>
           *)0x25f436);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>_>_>
  ::clear((unordered_map<unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>_>_>
           *)0x25f447);
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void clear_cache() {
    {
      std::unique_lock<std::mutex> lock(write_mtx_);
      while (!outbox_.empty()) {
        ::free((char *)outbox_.front().content.data());
        outbox_.pop_front();
      }
    }

    {
      std::unique_lock<std::mutex> lock(cb_mtx_);
      callback_map_.clear();
      future_map_.clear();
    }
  }